

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O2

void __thiscall
sai::ifstreambuf::ifstreambuf(ifstreambuf *this,span<const_unsigned_int,_256UL> DecryptionKey)

{
  _Head_base<0UL,_sai::VirtualPage_*,_false> _Var1;
  _Head_base<0UL,_sai::VirtualPage_*,_false> local_30;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__ifstreambuf_0010fd28;
  std::ifstream::ifstream(&this->FileIn);
  (this->Key)._M_ptr = DecryptionKey._M_ptr;
  this->CurrentPage = 0xffffffff;
  (this->PageCache)._M_t.
  super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
  super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
  super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl = (VirtualPage *)0x0;
  this->PageCacheIndex = 0xffffffff;
  (this->TableCache)._M_t.
  super___uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>._M_t.
  super__Tuple_impl<0UL,_sai::VirtualPage_*,_std::default_delete<sai::VirtualPage>_>.
  super__Head_base<0UL,_sai::VirtualPage_*,_false>._M_head_impl = (VirtualPage *)0x0;
  this->TableCacheIndex = 0xffffffff;
  this->PageCount = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::make_unique<sai::VirtualPage>();
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (pointer)0x0;
  std::__uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::reset
            ((__uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> *)
             &this->PageCache,_Var1._M_head_impl);
  std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::~unique_ptr
            ((unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> *)&local_30);
  std::make_unique<sai::VirtualPage>();
  _Var1._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (VirtualPage *)0x0;
  std::__uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::reset
            ((__uniq_ptr_impl<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> *)
             &this->TableCache,_Var1._M_head_impl);
  std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::~unique_ptr
            ((unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> *)&local_30);
  return;
}

Assistant:

ifstreambuf::ifstreambuf(std::span<const std::uint32_t, 256> DecryptionKey) : Key(DecryptionKey)
{
	setg(nullptr, nullptr, nullptr);
	setp(nullptr, nullptr);

	PageCache  = std::make_unique<VirtualPage>();
	TableCache = std::make_unique<VirtualPage>();
}